

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
hta::detail::
make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_long,_const_char_*,_unsigned_long>
::operator()(make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_long,_const_char_*,_unsigned_long>
             *this,stringstream *msg,char *arg,path *args,char *args_1,long args_2,char *args_3,
            unsigned_long args_4)

{
  make_exception<std::filesystem::__cxx11::path,_const_char_*,_long,_const_char_*,_unsigned_long>
  local_59;
  path local_58;
  
  std::operator<<((ostream *)(msg + 0x10),arg);
  std::filesystem::__cxx11::path::path(&local_58,args);
  make_exception<std::filesystem::__cxx11::path,_const_char_*,_long,_const_char_*,_unsigned_long>::
  operator()(&local_59,msg,&local_58,args_1,args_2,args_3,args_4);
  std::filesystem::__cxx11::path::~path(&local_58);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }